

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCReaderGen_2x3.h
# Opt level: O3

void __thiscall
Assimp::IFC::Schema_2x3::IfcDistributionControlElement::IfcDistributionControlElement
          (IfcDistributionControlElement *this)

{
  *(undefined ***)&this->field_0x180 = &PTR__Object_007e4a70;
  *(undefined8 *)&this->field_0x188 = 0;
  *(char **)&this->field_0x190 = "IfcDistributionControlElement";
  IfcDistributionElement::IfcDistributionElement
            ((IfcDistributionElement *)this,&PTR_construction_vtable_24__00850a10);
  (this->super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcDistributionControlElement,_1UL>).
  aux_is_derived.super__Base_bitset<1UL>._M_w = 0;
  *(undefined8 *)this = 0x8508e0;
  *(undefined8 *)&this->field_0x180 = 0x8509f8;
  *(undefined8 *)&this->field_0x88 = 0x850908;
  *(undefined8 *)&this->field_0x98 = 0x850930;
  *(undefined8 *)&this->field_0xd0 = 0x850958;
  *(undefined8 *)&this->field_0x100 = 0x850980;
  *(undefined8 *)&this->field_0x138 = 0x8509a8;
  (this->super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcDistributionControlElement,_1UL>).
  _vptr_ObjectHelper = (_func_int **)0x8509d0;
  *(undefined1 **)
   &(this->super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcDistributionControlElement,_1UL>).
    field_0x10 = &(this->
                  super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcDistributionControlElement,_1UL>).
                  field_0x20;
  *(undefined8 *)
   &(this->super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcDistributionControlElement,_1UL>).
    field_0x18 = 0;
  (this->super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcDistributionControlElement,_1UL>).field_0x20
       = 0;
  this->field_0x178 = 0;
  return;
}

Assistant:

IfcDistributionControlElement() : Object("IfcDistributionControlElement") {}